

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O2

string * cmStrCat<char_const(&)[7],std::__cxx11::string_const&,std::__cxx11::string_const&,char,std::__cxx11::string_const&,char_const(&)[16]>
                   (string *__return_storage_ptr__,char (*a) [7],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
                   char *args_1,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
                   char (*args_3) [16])

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  cmAlphaNum local_210;
  cmAlphaNum local_1d8;
  cmAlphaNum local_1a0;
  cmAlphaNum local_168;
  cmAlphaNum local_130;
  cmAlphaNum local_f8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_c0;
  string_view local_a8;
  string *local_98;
  string_view local_90;
  string *local_80;
  string_view local_78;
  string *local_68;
  string_view local_60;
  string *local_50;
  string_view local_48;
  string *local_38;
  
  cmAlphaNum::cmAlphaNum(&local_f8,*a);
  local_c0.first = cmAlphaNum::View(&local_f8);
  local_c0.second = local_f8.RValueString_;
  local_130.RValueString_ = (string *)0x0;
  local_130.View_._M_str = (b->_M_dataplus)._M_p;
  local_130.View_._M_len = b->_M_string_length;
  local_a8 = cmAlphaNum::View(&local_130);
  local_98 = local_130.RValueString_;
  local_168.RValueString_ = (string *)0x0;
  local_168.View_._M_str = (args->_M_dataplus)._M_p;
  local_168.View_._M_len = args->_M_string_length;
  local_90 = cmAlphaNum::View(&local_168);
  local_80 = local_168.RValueString_;
  local_210.Digits_[0] = *args_1;
  local_210.View_._M_str = local_210.Digits_;
  local_210.RValueString_ = (string *)0x0;
  local_210.View_._M_len = 1;
  local_78 = cmAlphaNum::View(&local_210);
  local_68 = local_210.RValueString_;
  local_1a0.RValueString_ = (string *)0x0;
  local_1a0.View_._M_str = (args_2->_M_dataplus)._M_p;
  local_1a0.View_._M_len = args_2->_M_string_length;
  local_60 = cmAlphaNum::View(&local_1a0);
  local_50 = local_1a0.RValueString_;
  cmAlphaNum::cmAlphaNum(&local_1d8,*args_3);
  local_48 = cmAlphaNum::View(&local_1d8);
  local_38 = local_1d8.RValueString_;
  views._M_len = 6;
  views._M_array = &local_c0;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}